

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall antlr::ASTFactory::ASTFactory(ASTFactory *this)

{
  char **__new_size;
  char **in_RDI;
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> pVar1;
  _func_ASTRefCount<antlr::AST> **in_stack_ffffffffffffffb8;
  value_type *in_stack_ffffffffffffffe0;
  code *this_00;
  
  *in_RDI = (char *)&PTR__ASTFactory_00468c28;
  __new_size = in_RDI + 1;
  this_00 = CommonAST::factory;
  pVar1 = std::make_pair<char_const*const&,antlr::ASTRefCount<antlr::AST>(*)()>
                    (in_RDI,in_stack_ffffffffffffffb8);
  *(pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)(in_RDI + 1) = pVar1;
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::vector((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            *)0x1f102e);
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::resize((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            *)this_00,(size_type)__new_size,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

ASTFactory::ASTFactory()
: default_factory_descriptor(ANTLR_USE_NAMESPACE(std)make_pair(CommonAST::TYPE_NAME,&CommonAST::factory))
{
	nodeFactories.resize( Token::MIN_USER_TYPE, &default_factory_descriptor );
}